

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

int mraa_pwm_lookup(char *pwm_name)

{
  char *__s;
  mraa_board_t *pmVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  pmVar1 = plat;
  if ((pwm_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*pwm_name != '\0')) {
    uVar5 = 0;
    uVar3 = (ulong)(uint)plat->pwm_dev_count;
    if (plat->pwm_dev_count < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
      __s = *(char **)((long)&pmVar1->pwm_dev[0].name + uVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar2 = strncmp(pwm_name,__s,sVar4 + 1);
        if (iVar2 == 0) {
          return *(int *)((long)&pmVar1->pwm_dev[0].index + uVar5);
        }
      }
    }
  }
  return -1;
}

Assistant:

int
mraa_pwm_lookup(const char* pwm_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (pwm_name == NULL || strlen(pwm_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->pwm_dev_count; i++) {
        if (plat->pwm_dev[i].name != NULL &&
            strncmp(pwm_name, plat->pwm_dev[i].name, strlen(plat->pwm_dev[i].name) + 1) == 0) {
            return plat->pwm_dev[i].index;
        }
    }
    return -1;
}